

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboCases::ResizeTest::render
          (ResizeTest *this,Context *context,Surface *dst)

{
  FboConfig *config;
  DataType type;
  DataType outputType;
  deUint32 program;
  deUint32 program_00;
  deUint32 program_01;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  DataTypes *pDVar4;
  int in_R9D;
  Vector<float,_4> local_5a8;
  Vector<float,_4> local_598;
  Surface *local_588;
  ResizeTest *local_580;
  Framebuffer fbo;
  TextureFormat colorFormat;
  Vec4 fboOutBias;
  Vec4 fboOutScale;
  TextureFormatInfo fboRangeInfo;
  Vector<float,_4> local_4d8;
  FlatColorShader flatShader;
  Texture2DShader texFromFboShader;
  Texture2DShader texToFboShader;
  
  local_588 = dst;
  local_580 = this;
  colorFormat = glu::mapGLInternalFormat((this->super_FboRenderCase).m_config.colorFormat);
  type = glu::getSampler2DType(colorFormat);
  outputType = FboTestUtil::getFragmentOutputType(&colorFormat);
  tcu::getTextureFormatInfo(&fboRangeInfo,&colorFormat);
  tcu::operator-((tcu *)&fboOutScale,&fboRangeInfo.valueMax,&fboRangeInfo.valueMin);
  tcu::Vector<float,_4>::Vector(&fboOutBias,&fboRangeInfo.valueMin);
  texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  texFromFboShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texFromFboShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar4 = FboTestUtil::DataTypes::operator<<((DataTypes *)&texFromFboShader,TYPE_SAMPLER_2D);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&flatShader,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fbo,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texToFboShader,pDVar4,outputType,(Vec4 *)&flatShader,(Vec4 *)&fbo);
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
            ((_Vector_base<glu::DataType,_std::allocator<glu::DataType>_> *)&texFromFboShader);
  flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar4 = FboTestUtil::DataTypes::operator<<((DataTypes *)&flatShader,type);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fbo,1.0);
  tcu::Vector<float,_4>::Vector(&local_5a8,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texFromFboShader,pDVar4,TYPE_FLOAT_VEC4,(Vec4 *)&fbo,&local_5a8);
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
            ((_Vector_base<glu::DataType,_std::allocator<glu::DataType>_> *)&flatShader);
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,outputType);
  program = (*context->_vptr_Context[0x75])(context,&texToFboShader);
  program_00 = (*context->_vptr_Context[0x75])(context,&texFromFboShader);
  program_01 = (*context->_vptr_Context[0x75])(context,&flatShader);
  config = &(local_580->super_FboRenderCase).m_config;
  uVar3 = config->buffers;
  FboTestUtil::Texture2DShader::setOutScaleBias(&texToFboShader,&fboOutScale,&fboOutBias);
  FboTestUtil::Texture2DShader::setTexScaleBias
            (&texFromFboShader,0,&fboRangeInfo.lookupScale,&fboRangeInfo.lookupBias);
  createQuadsTex2D(context,1,0x1907,0x40,0x40,in_R9D);
  createMetaballsTex2D(context,2,0x1907,0x20,0x20,in_R9D);
  Functional::Framebuffer::Framebuffer(&fbo,context,config,0x80,0x80,0,0,0);
  Functional::Framebuffer::checkCompleteness(&fbo);
  FboTestUtil::Texture2DShader::setUniforms(&texToFboShader,context,program);
  FboTestUtil::Texture2DShader::setUniforms(&texFromFboShader,context,program_00);
  local_4d8.m_data[0] = 0.0;
  local_4d8.m_data[1] = 1.0;
  local_4d8.m_data[2] = 0.0;
  local_4d8.m_data[3] = 1.0;
  tcu::operator*((tcu *)&local_598,&local_4d8,&fboOutScale);
  tcu::operator+((tcu *)&local_5a8,&local_598,&fboOutBias);
  FboTestUtil::FlatColorShader::setColor(&flatShader,context,program_01,&local_5a8);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fbo.m_framebuffer);
  (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
  local_5a8.m_data[0] = 0.0;
  local_5a8.m_data[1] = 0.0;
  local_5a8.m_data[2] = 0.0;
  local_5a8.m_data[3] = 1.0;
  FboTestUtil::clearColorBuffer(context,&colorFormat,&local_5a8);
  (*context->_vptr_Context[0x2d])(context,0x500);
  (*context->_vptr_Context[6])(context,0xde1,1);
  local_5a8.m_data[0] = -1.0;
  local_5a8.m_data[1] = -1.0;
  local_5a8.m_data._8_8_ = local_5a8.m_data._8_8_ & 0xffffffff00000000;
  local_598.m_data[0] = 1.0;
  local_598.m_data[1] = 1.0;
  local_598.m_data[2] = 0.0;
  sglr::drawQuad(context,program,(Vec3 *)&local_5a8,(Vec3 *)&local_598);
  if (fbo.m_config.colorType == 0xde1) {
    (*context->_vptr_Context[9])(context,0x8d40,0);
    uVar1 = (*context->_vptr_Context[2])(context);
    uVar2 = (*context->_vptr_Context[3])(context);
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar1,(ulong)uVar2);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)fbo.m_colorBuffer);
    local_5a8.m_data[0] = -1.0;
    local_5a8.m_data[1] = -1.0;
    local_5a8.m_data._8_8_ = local_5a8.m_data._8_8_ & 0xffffffff00000000;
    local_598.m_data[0] = 1.0;
    local_598.m_data[1] = 1.0;
    local_598.m_data[2] = 0.0;
    sglr::drawQuad(context,program_00,(Vec3 *)&local_5a8,(Vec3 *)&local_598);
    (*context->_vptr_Context[9])(context,0x8d40,(ulong)fbo.m_framebuffer);
  }
  if (fbo.m_config.colorType == 0x8d41) {
    (*context->_vptr_Context[0xc])(context,0x8d41,(ulong)fbo.m_colorBuffer);
    (*context->_vptr_Context[0x23])(context,0x8d41,(ulong)fbo.m_config.colorFormat,0x40,0x20);
  }
  else if (fbo.m_config.colorType == 0xde1) {
    (*context->_vptr_Context[6])(context,0xde1,(ulong)fbo.m_colorBuffer);
    (*context->_vptr_Context[0x7e])(context,0xde1,0,(ulong)fbo.m_config.colorFormat,0x40,0x20);
  }
  if ((uVar3 & 0x500) != 0) {
    if (fbo.m_config.depthStencilType == 0x8d41) {
      (*context->_vptr_Context[0xc])(context,0x8d41,(ulong)fbo.m_depthStencilBuffer);
      (*context->_vptr_Context[0x23])
                (context,0x8d41,(ulong)fbo.m_config.depthStencilFormat,0x40,0x20);
    }
    else if (fbo.m_config.depthStencilType == 0xde1) {
      (*context->_vptr_Context[6])(context,0xde1,(ulong)fbo.m_depthStencilBuffer);
      (*context->_vptr_Context[0x7e])
                (context,0xde1,0,(ulong)fbo.m_config.depthStencilFormat,0x40,0x20);
    }
  }
  (*context->_vptr_Context[5])(context,0,0,0x40,0x20);
  local_5a8.m_data[0] = 1.0;
  local_5a8.m_data[1] = 0.0;
  local_5a8.m_data[2] = 0.0;
  local_5a8.m_data[3] = 1.0;
  FboTestUtil::clearColorBuffer(context,&colorFormat,&local_5a8);
  (*context->_vptr_Context[0x2d])(context,0x500);
  (*context->_vptr_Context[0x33])(context,0xb71);
  (*context->_vptr_Context[6])(context,0xde1,2);
  local_5a8.m_data[0] = -1.0;
  local_5a8.m_data[1] = -1.0;
  local_5a8.m_data._8_8_ = local_5a8.m_data._8_8_ & 0xffffffff00000000;
  local_598.m_data[0] = 1.0;
  local_598.m_data[1] = 1.0;
  local_598.m_data[2] = 0.0;
  sglr::drawQuad(context,program,(Vec3 *)&local_5a8,(Vec3 *)&local_598);
  (*context->_vptr_Context[6])(context,0xde1,1);
  local_5a8.m_data[0] = 0.0;
  local_5a8.m_data[1] = 0.0;
  local_5a8.m_data[2] = -1.0;
  local_598.m_data._0_8_ = (undefined1 *)0x3f8000003f800000;
  local_598.m_data[2] = 1.0;
  sglr::drawQuad(context,program,(Vec3 *)&local_5a8,(Vec3 *)&local_598);
  (*context->_vptr_Context[0x34])(context,0xb71);
  if ((uVar3 >> 10 & 1) != 0) {
    (*context->_vptr_Context[0x33])(context,0xc11);
    (*context->_vptr_Context[0x2c])(context,1);
    (*context->_vptr_Context[0x32])(context,10,10,5,0xf);
    (*context->_vptr_Context[0x2d])(context,0x400);
    (*context->_vptr_Context[0x34])(context,0xc11);
    (*context->_vptr_Context[0x33])(context,0xb90);
    (*context->_vptr_Context[0x35])(context,0x202,1,0xff);
    local_5a8.m_data[0] = -1.0;
    local_5a8.m_data[1] = -1.0;
    local_5a8.m_data[2] = 0.0;
    local_598.m_data._0_8_ = (undefined1 *)0x3f8000003f800000;
    local_598.m_data[2] = 0.0;
    sglr::drawQuad(context,program_01,(Vec3 *)&local_5a8,(Vec3 *)&local_598);
    (*context->_vptr_Context[0x34])(context,0xb90);
  }
  if ((local_580->super_FboRenderCase).m_config.colorType == 0xde1) {
    (*context->_vptr_Context[9])(context,0x8d40,0);
    uVar3 = (*context->_vptr_Context[2])(context);
    uVar1 = (*context->_vptr_Context[3])(context);
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar3,(ulong)uVar1);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)fbo.m_colorBuffer);
    local_5a8.m_data[0] = -0.5;
    local_5a8.m_data[1] = -0.5;
    local_5a8.m_data[2] = 0.0;
    local_598.m_data._0_8_ = &DAT_3f0000003f000000;
    local_598.m_data[2] = 0.0;
    sglr::drawQuad(context,program_00,(Vec3 *)&local_5a8,(Vec3 *)&local_598);
    uVar3 = (*context->_vptr_Context[2])(context);
    uVar1 = (*context->_vptr_Context[3])(context);
    (*context->_vptr_Context[0x80])(context,local_588,0,0,(ulong)uVar3,(ulong)uVar1);
  }
  else {
    FboTestUtil::readPixels
              (context,local_588,0,0,0x40,0x20,&colorFormat,&fboRangeInfo.lookupScale,
               &fboRangeInfo.lookupBias);
  }
  Functional::Framebuffer::~Framebuffer(&fbo);
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texFromFboShader);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texToFboShader);
  return;
}

Assistant:

void ResizeTest::render (sglr::Context& context, Surface& dst)
{
	tcu::TextureFormat		colorFormat			= glu::mapGLInternalFormat(m_config.colorFormat);
	glu::DataType			fboSamplerType		= glu::getSampler2DType(colorFormat);
	glu::DataType			fboOutputType		= getFragmentOutputType(colorFormat);
	tcu::TextureFormatInfo	fboRangeInfo		= tcu::getTextureFormatInfo(colorFormat);
	Vec4					fboOutScale			= fboRangeInfo.valueMax - fboRangeInfo.valueMin;
	Vec4					fboOutBias			= fboRangeInfo.valueMin;

	Texture2DShader			texToFboShader		(DataTypes() << glu::TYPE_SAMPLER_2D, fboOutputType);
	Texture2DShader			texFromFboShader	(DataTypes() << fboSamplerType, glu::TYPE_FLOAT_VEC4);
	FlatColorShader			flatShader			(fboOutputType);
	deUint32				texToFboShaderID	= context.createProgram(&texToFboShader);
	deUint32				texFromFboShaderID	= context.createProgram(&texFromFboShader);
	deUint32				flatShaderID		= context.createProgram(&flatShader);

	deUint32				quadsTex			= 1;
	deUint32				metaballsTex		= 2;
	bool					depth				= (m_config.buffers & GL_DEPTH_BUFFER_BIT)		!= 0;
	bool					stencil				= (m_config.buffers & GL_STENCIL_BUFFER_BIT)	!= 0;
	int						initialWidth		= 128;
	int						initialHeight		= 128;
	int						newWidth			= 64;
	int						newHeight			= 32;

	texToFboShader.setOutScaleBias(fboOutScale, fboOutBias);
	texFromFboShader.setTexScaleBias(0, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);

	createQuadsTex2D(context, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createMetaballsTex2D(context, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 32, 32);

	Framebuffer fbo(context, m_config, initialWidth, initialHeight);
	fbo.checkCompleteness();

	// Setup shaders
	texToFboShader.setUniforms	(context, texToFboShaderID);
	texFromFboShader.setUniforms(context, texFromFboShaderID);
	flatShader.setColor			(context, flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f) * fboOutScale + fboOutBias);

	// Render quads
	context.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	context.viewport(0, 0, initialWidth, initialHeight);
	clearColorBuffer(context, colorFormat, tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
	context.clear(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	sglr::drawQuad(context, texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	if (fbo.getConfig().colorType == GL_TEXTURE_2D)
	{
		// Render fbo to screen
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		context.bindTexture(GL_TEXTURE_2D, fbo.getColorBuffer());
		sglr::drawQuad(context, texFromFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Restore binding
		context.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	}

	// Resize buffers
	switch (fbo.getConfig().colorType)
	{
		case GL_TEXTURE_2D:
			context.bindTexture(GL_TEXTURE_2D, fbo.getColorBuffer());
			context.texImage2D(GL_TEXTURE_2D, 0, fbo.getConfig().colorFormat, newWidth, newHeight);
			break;

		case GL_RENDERBUFFER:
			context.bindRenderbuffer(GL_RENDERBUFFER, fbo.getColorBuffer());
			context.renderbufferStorage(GL_RENDERBUFFER, fbo.getConfig().colorFormat, newWidth, newHeight);
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	if (depth || stencil)
	{
		switch (fbo.getConfig().depthStencilType)
		{
			case GL_TEXTURE_2D:
				context.bindTexture(GL_TEXTURE_2D, fbo.getDepthStencilBuffer());
				context.texImage2D(GL_TEXTURE_2D, 0, fbo.getConfig().depthStencilFormat, newWidth, newHeight);
				break;

			case GL_RENDERBUFFER:
				context.bindRenderbuffer(GL_RENDERBUFFER, fbo.getDepthStencilBuffer());
				context.renderbufferStorage(GL_RENDERBUFFER, fbo.getConfig().depthStencilFormat, newWidth, newHeight);
				break;

			default:
				DE_ASSERT(false);
		}
	}

	// Render to resized fbo
	context.viewport(0, 0, newWidth, newHeight);
	clearColorBuffer(context, colorFormat, tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	context.clear(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	context.enable(GL_DEPTH_TEST);

	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(context, texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));

	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	sglr::drawQuad(context, texToFboShaderID, Vec3(0.0f, 0.0f, -1.0f), Vec3(+1.0f, +1.0f, 1.0f));

	context.disable(GL_DEPTH_TEST);

	if (stencil)
	{
		context.enable(GL_SCISSOR_TEST);
		context.clearStencil(1);
		context.scissor(10, 10, 5, 15);
		context.clear(GL_STENCIL_BUFFER_BIT);
		context.disable(GL_SCISSOR_TEST);

		context.enable(GL_STENCIL_TEST);
		context.stencilFunc(GL_EQUAL, 1, 0xffu);
		sglr::drawQuad(context, flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));
		context.disable(GL_STENCIL_TEST);
	}

	if (m_config.colorType == GL_TEXTURE_2D)
	{
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		context.bindTexture(GL_TEXTURE_2D, fbo.getColorBuffer());
		sglr::drawQuad(context, texFromFboShaderID, Vec3(-0.5f, -0.5f, 0.0f), Vec3(0.5f, 0.5f, 0.0f));
		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
		readPixels(context, dst, 0, 0, newWidth, newHeight, colorFormat, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);
}